

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int gen_publickey_from_ec_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,int is_sk,EVP_PKEY *pk)

{
  bool bVar1;
  uchar *puVar2;
  int iVar3;
  BN_CTX *ctx;
  ec_key_st *key;
  EC_POINT *p_00;
  EC_GROUP *group;
  EC_GROUP *group_00;
  size_t __size;
  uchar *buf;
  size_t sVar4;
  uchar *puVar5;
  char *pcVar6;
  size_t sVar7;
  uchar *p;
  uchar *local_60;
  uchar *local_50;
  size_t *local_48;
  uchar **local_40;
  uchar **local_38;
  
  local_38 = method;
  ctx = BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    return -1;
  }
  local_40 = pubkeydata;
  key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pk);
  if (key == (ec_key_st *)0x0) {
    buf = (uchar *)0x0;
    local_60 = (uchar *)0x0;
  }
  else {
    p_00 = EC_KEY_get0_public_key(key);
    group = EC_KEY_get0_group(key);
    group_00 = EC_KEY_get0_group(key);
    iVar3 = EC_GROUP_get_curve_name(group_00);
    sVar7 = 0x22;
    if (is_sk == 0) {
      sVar7 = 0x13;
    }
    *method_len = sVar7;
    local_60 = (uchar *)(*session->alloc)(sVar7,&session->abstract);
    if (local_60 == (uchar *)0x0) {
      iVar3 = _libssh2_error(session,-6,"out of memory");
      return iVar3;
    }
    local_48 = pubkeydata_len;
    if (is_sk == 0) {
      if (iVar3 == 0x2cc) {
        sVar7 = *method_len;
        pcVar6 = "ecdsa-sha2-nistp521";
        goto LAB_00112355;
      }
      if (iVar3 == 0x2cb) {
        sVar7 = *method_len;
        pcVar6 = "ecdsa-sha2-nistp384";
LAB_001123df:
        memcpy(local_60,pcVar6,sVar7);
        goto LAB_001123e7;
      }
      if (iVar3 == 0x19f) {
        sVar7 = *method_len;
        pcVar6 = "ecdsa-sha2-nistp256";
        goto LAB_001123df;
      }
    }
    else {
      sVar7 = *method_len;
      pcVar6 = "sk-ecdsa-sha2-nistp256@openssh.com";
LAB_00112355:
      memcpy(local_60,pcVar6,sVar7);
LAB_001123e7:
      buf = (uchar *)0x0;
      __size = EC_POINT_point2oct(group,p_00,POINT_CONVERSION_UNCOMPRESSED,(uchar *)0x0,0,ctx);
      bVar1 = false;
      if (0x85 < __size) goto LAB_001124e8;
      buf = (uchar *)malloc(__size);
      if (buf != (uchar *)0x0) {
        sVar4 = EC_POINT_point2oct(group,p_00,POINT_CONVERSION_UNCOMPRESSED,buf,__size,ctx);
        if (sVar4 == __size) {
          sVar7 = __size + *method_len + 0x14;
          puVar5 = (uchar *)(*session->alloc)(sVar7,&session->abstract);
          if (puVar5 != (uchar *)0x0) {
            local_50 = puVar5;
            _libssh2_store_str(&local_50,(char *)local_60,*method_len);
            puVar2 = (uchar *)"ecdsa-sha2-nistp256";
            if (is_sk == 0) {
              puVar2 = local_60;
            }
            _libssh2_store_str(&local_50,(char *)(puVar2 + 0xb),8);
            _libssh2_store_str(&local_50,(char *)buf,__size);
            *local_38 = local_60;
            *local_40 = puVar5;
            *local_48 = sVar7;
            bVar1 = true;
            goto LAB_001124e8;
          }
        }
        goto LAB_001124e6;
      }
    }
    buf = (uchar *)0x0;
  }
LAB_001124e6:
  bVar1 = false;
LAB_001124e8:
  if (key != (ec_key_st *)0x0) {
    EC_KEY_free(key);
  }
  BN_CTX_free(ctx);
  if (buf != (uchar *)0x0) {
    free(buf);
  }
  if (!bVar1) {
    if (local_60 != (uchar *)0x0) {
      (*session->free)(local_60,&session->abstract);
    }
    return -1;
  }
  return 0;
}

Assistant:

static int
gen_publickey_from_ec_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          int is_sk,
                          EVP_PKEY *pk)
{
    int rc = 0;
    EC_KEY *ec = NULL;
    unsigned char *p;
    unsigned char *method_buf = NULL;
    unsigned char *key;
    size_t  key_len = 0;
    unsigned char *octal_value = NULL;
    size_t octal_len;
    const EC_POINT *public_key;
    const EC_GROUP *group;
    BN_CTX *bn_ctx;
    libssh2_curve_type type;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from EC private key envelope"));

    bn_ctx = BN_CTX_new();
    if(!bn_ctx)
        return -1;

    ec = EVP_PKEY_get1_EC_KEY(pk);
    if(!ec) {
        rc = -1;
        goto clean_exit;
    }

    public_key = EC_KEY_get0_public_key(ec);
    group = EC_KEY_get0_group(ec);
    type = _libssh2_ecdsa_get_curve_type(ec);

    if(is_sk)
        *method_len = 34;
    else
        *method_len = 19;

    method_buf = LIBSSH2_ALLOC(session, *method_len);
    if(!method_buf) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "out of memory");
    }

    if(is_sk)
        memcpy(method_buf, "sk-ecdsa-sha2-nistp256@openssh.com", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP256)
        memcpy(method_buf, "ecdsa-sha2-nistp256", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP384)
        memcpy(method_buf, "ecdsa-sha2-nistp384", *method_len);
    else if(type == LIBSSH2_EC_CURVE_NISTP521)
        memcpy(method_buf, "ecdsa-sha2-nistp521", *method_len);
    else {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_ERROR,
                       "Unsupported EC private key type"));
        rc = -1;
        goto clean_exit;
    }

    /* get length */
    octal_len = EC_POINT_point2oct(group, public_key,
                                   POINT_CONVERSION_UNCOMPRESSED,
                                   NULL, 0, bn_ctx);
    if(octal_len > EC_MAX_POINT_LEN) {
        rc = -1;
        goto clean_exit;
    }

    octal_value = malloc(octal_len);
    if(!octal_value) {
        rc = -1;
        goto clean_exit;
    }

    /* convert to octal */
    if(EC_POINT_point2oct(group, public_key, POINT_CONVERSION_UNCOMPRESSED,
       octal_value, octal_len, bn_ctx) != octal_len) {
        rc = -1;
        goto clean_exit;
    }

    /* Key form is: type_len(4) + type(method_len) + domain_len(4) + domain(8)
       + pub_key_len(4) + pub_key(~65). */
    key_len = 4 + *method_len + 4 + 8 + 4 + octal_len;
    key = LIBSSH2_ALLOC(session, key_len);
    if(!key) {
        rc = -1;
        goto clean_exit;
    }

    /* Process key encoding. */
    p = key;

    /* Key type */
    _libssh2_store_str(&p, (const char *)method_buf, *method_len);

    /* Name domain */
    if(is_sk) {
        _libssh2_store_str(&p, "nistp256", 8);
    }
    else {
        _libssh2_store_str(&p, (const char *)method_buf + 11, 8);
    }

    /* Public key */
    _libssh2_store_str(&p, (const char *)octal_value, octal_len);

    *method         = method_buf;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;

clean_exit:

    if(ec)
        EC_KEY_free(ec);

    if(bn_ctx) {
        BN_CTX_free(bn_ctx);
    }

    if(octal_value)
        free(octal_value);

    if(rc == 0)
        return 0;

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    return -1;
}